

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

void __thiscall CLayer::CreateBoundary(CLayer *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = IsHorizontal(this);
  if (iVar1 == 0) {
    iVar1 = IsVertical(this);
    if (iVar1 == 0) {
      __assert_fail("IsHorizontal()||IsVertical()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                    ,0xb1,"void CLayer::CreateBoundary()");
    }
  }
  iVar1 = IsHorizontal(this);
  uVar4 = (uint)(CObject::m_pDesign->super_CBBox).m_iMinX;
  if (iVar1 == 0) {
    uVar4 = -uVar4;
    uVar2 = ~(int)(CObject::m_pDesign->super_CBBox).m_iMinY +
            (int)(CObject::m_pDesign->super_CBBox).m_iMaxY;
  }
  else {
    uVar4 = ~uVar4;
    uVar2 = (int)(CObject::m_pDesign->super_CBBox).m_iMaxY -
            (int)(CObject::m_pDesign->super_CBBox).m_iMinY;
  }
  iVar1 = uVar4 + (int)(CObject::m_pDesign->super_CBBox).m_iMaxX;
  uVar3 = (ulong)uVar2;
  this->m_iMaxBX = iVar1;
  this->m_iMaxBY = uVar2;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar5 = 0;
        lVar7 = 0;
        do {
          CBoundary::Initialize
                    ((CBoundary *)((long)this->m_ppGrid[lVar6]->m_pAdjGrid + lVar5 + -0x78),
                     (int)lVar6,(int)lVar7,(int)(this->super_CObject).m_Key,this);
          lVar7 = lVar7 + 1;
          uVar3 = (ulong)this->m_iMaxBY;
          lVar5 = lVar5 + 0x98;
        } while (lVar7 < (long)uVar3);
        iVar1 = this->m_iMaxBX;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar1);
  }
  return;
}

Assistant:

void CLayer::CreateBoundary()
{ 
	assert(IsHorizontal()||IsVertical());

	// different size of boundary array by direction [6/22/2006 thyeros]
	if(IsHorizontal())	
	{
		m_iMaxBX	=	GetDesign()->W()-1;
		m_iMaxBY	=	GetDesign()->H();
	}
	else		
	{
		m_iMaxBX	=	GetDesign()->W();
		m_iMaxBY	=	GetDesign()->H()-1;
	}

	for (int i=0;i<m_iMaxBX;++i)
		for (int j=0;j<m_iMaxBY;++j)
			GetBoundary(i,j)->CBoundary::Initialize(i,j,GetKey(),this);
}